

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackTarCompressGenerator.cxx
# Opt level: O1

void __thiscall
cmCPackTarCompressGenerator::cmCPackTarCompressGenerator(cmCPackTarCompressGenerator *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"paxr","");
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressCompress,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackTarCompressGenerator_005f7e48;
  return;
}

Assistant:

cmCPackTarCompressGenerator::cmCPackTarCompressGenerator()
  :cmCPackArchiveGenerator(cmArchiveWrite::CompressCompress,
                           "paxr")
{
}